

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::verifyResourceIndexQuery
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resourceList,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *referenceResources,GLuint program)

{
  code *pcVar1;
  uint uVar2;
  GLenum GVar3;
  GLuint GVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  size_type sVar11;
  undefined8 uVar12;
  const_reference pvVar13;
  const_reference __rhs;
  MessageBuilder local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  MessageBuilder local_9a8;
  MessageBuilder local_828;
  uint local_6a4;
  undefined1 local_6a0 [4];
  GLuint index_1;
  string queryString;
  string local_678;
  int local_654;
  undefined1 local_650 [4];
  int ndx_1;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  uint local_1cc;
  int local_1c8;
  GLuint index;
  int ndx;
  MessageBuilder local_1b8;
  byte local_35;
  GLenum local_34;
  bool error;
  long lStack_30;
  GLenum programInterface;
  Functions *gl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  GLuint program_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *referenceResources_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resourceList_local;
  ResourceListTestCase *this_local;
  
  gl._4_4_ = program;
  pvStack_20 = referenceResources;
  referenceResources_local = resourceList;
  resourceList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar6);
  local_34 = getProgramInterfaceGLEnum(this->m_programInterface);
  local_35 = 0;
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_1b8,
                       (char (*) [78])
                       "Verifying GetProgramResourceIndex returns correct indices for resource names."
                      );
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  for (local_1c8 = 0; iVar6 = local_1c8,
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(pvStack_20), GVar4 = gl._4_4_, GVar3 = local_34, iVar6 < (int)sVar11;
      local_1c8 = local_1c8 + 1) {
    pcVar1 = *(code **)(lStack_30 + 0x9a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](pvStack_20,(long)local_1c8);
    uVar12 = std::__cxx11::string::c_str();
    local_1cc = (*pcVar1)(GVar4,GVar3,uVar12);
    dVar7 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar7,"query resource index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x449);
    uVar2 = local_1cc;
    if (local_1cc == 0xffffffff) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_350,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_350,(char (*) [29])"Error, for active resource \"");
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvStack_20,(long)local_1c8);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar13);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [30])"\" got index GL_INVALID_INDEX.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      local_35 = 1;
    }
    else {
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(referenceResources_local);
      if ((int)uVar2 < (int)sVar11) {
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](referenceResources_local,(ulong)local_1cc);
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvStack_20,(long)local_1c8);
        bVar5 = std::operator!=(pvVar13,__rhs);
        if (bVar5) {
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_650,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar10 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_650,
                               (char (*) [29])"Error, for active resource \"");
          pvVar13 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](pvStack_20,(long)local_1c8);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar13);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [22])"\" got index (index = ")
          ;
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1cc);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [24])") of another resource (");
          pvVar13 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](referenceResources_local,(ulong)local_1cc);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar13);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2c23dab);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_650);
          local_35 = 1;
        }
      }
      else {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_4d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_4d0,(char (*) [29])"Error, for active resource \"");
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](pvStack_20,(long)local_1c8);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar13);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])"\" got index ");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1cc);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [43])" (larger or equal to GL_ACTIVE_RESOURCES).");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4d0);
        local_35 = 1;
      }
    }
  }
  if (this->m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING) {
    for (local_654 = 0; iVar6 = local_654,
        sVar11 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pvStack_20), iVar6 < (int)sVar11; local_654 = local_654 + 1) {
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](pvStack_20,(long)local_654);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"[0]",
                 (allocator<char> *)(queryString.field_2._M_local_buf + 0xf));
      bVar5 = de::endsWith(pvVar13,&local_678);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator((allocator<char> *)(queryString.field_2._M_local_buf + 0xf));
      if (bVar5) {
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](pvStack_20,(long)local_654);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvStack_20,(long)local_654);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_6a0,(ulong)pvVar13);
        GVar4 = gl._4_4_;
        GVar3 = local_34;
        pcVar1 = *(code **)(lStack_30 + 0x9a8);
        uVar12 = std::__cxx11::string::c_str();
        local_6a4 = (*pcVar1)(GVar4,GVar3,uVar12);
        dVar7 = (**(code **)(lStack_30 + 0x800))();
        glu::checkError(dVar7,"query resource index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x466);
        uVar2 = local_6a4;
        if (local_6a4 == 0xffffffff) {
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_828,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<(&local_828,(char (*) [19])"Error, query for \"")
          ;
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6a0);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [38])"\" resulted in index GL_INVALID_INDEX.");
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_828);
          local_35 = 1;
        }
        else {
          sVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(referenceResources_local);
          if ((int)uVar2 < (int)sVar11) {
            pvVar13 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](referenceResources_local,(ulong)local_6a4);
            std::operator+(&local_9c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_6a0,"[0]");
            bVar5 = std::operator!=(pvVar13,&local_9c8);
            std::__cxx11::string::~string((string *)&local_9c8);
            if (bVar5) {
              pTVar9 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_b48,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (&local_b48,(char (*) [19])"Error, query for \"");
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_6a0);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(char (*) [22])"\" got index (index = ");
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_6a4);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(char (*) [25])") of another resource (\"");
              pvVar13 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](referenceResources_local,(ulong)local_6a4);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pvVar13);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])"\").");
              tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_b48);
              local_35 = 1;
            }
          }
          else {
            pTVar9 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_9a8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (&local_9a8,(char (*) [19])"Error, query for \"");
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_6a0);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [21])"\" resulted in index ");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_6a4);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [43])" (larger or equal to GL_ACTIVE_RESOURCES)."
                                );
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_9a8);
            local_35 = 1;
          }
        }
        std::__cxx11::string::~string((string *)local_6a0);
      }
    }
  }
  return (bool)((local_35 ^ 0xff) & 1);
}

Assistant:

bool ResourceListTestCase::verifyResourceIndexQuery (const std::vector<std::string>& resourceList, const std::vector<std::string>& referenceResources, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	bool					error				= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying GetProgramResourceIndex returns correct indices for resource names." << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
	{
		const glw::GLuint index = gl.getProgramResourceIndex(program, programInterface, referenceResources[ndx].c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (index == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if ((int)index >= (int)resourceList.size())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
			error = true;
		}
		else if (resourceList[index] != referenceResources[ndx])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, for active resource \"" << referenceResources[ndx] << "\" got index (index = " << index << ") of another resource (" << resourceList[index] << ")." << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Query for "name" should match "name[0]" except for XFB

	if (m_programInterface != PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING)
	{
		for (int ndx = 0; ndx < (int)referenceResources.size(); ++ndx)
		{
			if (de::endsWith(referenceResources[ndx], "[0]"))
			{
				const std::string	queryString	= referenceResources[ndx].substr(0, referenceResources[ndx].length()-3);
				const glw::GLuint	index		= gl.getProgramResourceIndex(program, programInterface, queryString.c_str());
				GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

				if (index == GL_INVALID_INDEX)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index GL_INVALID_INDEX." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if ((int)index >= (int)resourceList.size())
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" resulted in index " << index << " (larger or equal to GL_ACTIVE_RESOURCES)." << tcu::TestLog::EndMessage;
					error = true;
				}
				else if (resourceList[index] != queryString + "[0]")
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for \"" << queryString << "\" got index (index = " << index << ") of another resource (\"" << resourceList[index] << "\")." << tcu::TestLog::EndMessage;
					error = true;
				}
			}
		}
	}

	return !error;
}